

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O2

void __thiscall transwarp::detail::thread_pool::thread_pool(thread_pool *this,size_t n_threads)

{
  pointer ptVar1;
  invalid_parameter *this_00;
  pointer ptVar2;
  long lVar3;
  thread thread;
  thread local_70;
  condition_variable *local_68;
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *local_60;
  thread_pool *local_58;
  string local_50;
  
  this->done_ = false;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            (&this->functors_);
  local_68 = &this->cond_var_;
  local_60 = &this->functors_;
  std::condition_variable::condition_variable(local_68);
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  if (n_threads == 0) {
    this_00 = (invalid_parameter *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_50,"number of threads",(allocator *)&thread);
    invalid_parameter::invalid_parameter(this_00,&local_50);
    __cxa_throw(this_00,&invalid_parameter::typeinfo,std::runtime_error::~runtime_error);
  }
  ptVar2 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)ptVar1 - (long)ptVar2;
  while( true ) {
    if ((lVar3 >> 3) + n_threads <= (ulong)((long)ptVar1 - (long)ptVar2 >> 3)) {
      return;
    }
    thread._M_id._M_thread = (id)0;
    local_50._M_dataplus._M_p = (pointer)worker;
    local_50._M_string_length = 0;
    local_58 = this;
    std::thread::
    thread<void(transwarp::detail::thread_pool::*)(),transwarp::detail::thread_pool*,void>
              (&local_70,(type *)&local_50,&local_58);
    if (thread._M_id._M_thread != 0) break;
    thread._M_id._M_thread = (id)(id)local_70;
    local_70._M_id._M_thread = (id)0;
    std::thread::~thread(&local_70);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&this->threads_,&thread);
    std::thread::~thread(&thread);
    ptVar2 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::terminate();
}

Assistant:

explicit thread_pool(std::size_t n_threads)
    : done_(false)
    {
        if (n_threads == 0) {
            throw transwarp::invalid_parameter("number of threads");
        }
        const std::size_t n_target = threads_.size() + n_threads;
        while (threads_.size() < n_target) {
            std::thread thread;
            try {
                thread = std::thread(&thread_pool::worker, this);
            } catch (...) {
                shutdown();
                throw;
            }
            try {
                threads_.push_back(std::move(thread));
            } catch (...) {
                shutdown();
                thread.join();
                throw;
            }
        }
    }